

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::SocketHandlerListening(CConnman *this,EventsPerSock *events_per_sock)

{
  long lVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
  hListenSocket;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true> *in_RSI;
  long in_FS_OFFSET;
  ListenSocket *listen_socket;
  vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *__range1;
  const_iterator it;
  iterator __end1;
  iterator __begin1;
  CThreadInterrupt *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  _Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
  *in_stack_ffffffffffffff78;
  CConnman *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::begin
            ((vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::end
            ((vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  while (bVar2 = __gnu_cxx::
                 operator==<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                           ((__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                             *)in_stack_ffffffffffffff78,
                            (__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
    ::operator*((__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                 *)in_stack_ffffffffffffff68);
    bVar2 = CThreadInterrupt::operator_cast_to_bool(in_stack_ffffffffffffff68);
    if (bVar2) break;
    in_stack_ffffffffffffff78 = in_RSI;
    std::shared_ptr<Sock_const>::shared_ptr<Sock,void>
              ((shared_ptr<const_Sock> *)in_stack_ffffffffffffff68,(shared_ptr<Sock> *)0x211b1b);
    std::
    unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
    ::find((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
            *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
           (key_type *)in_stack_ffffffffffffff68);
    std::shared_ptr<const_Sock>::~shared_ptr((shared_ptr<const_Sock> *)in_stack_ffffffffffffff68);
    hListenSocket._M_cur =
         (__node_type *)
         std::
         unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
         ::end((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    bVar2 = std::__detail::operator==
                      (in_stack_ffffffffffffff78,
                       (_Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                        *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff77 = false;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                             *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff77 = ((pvVar3->second).occurred & 1) != 0;
    }
    if ((bool)in_stack_ffffffffffffff77 != false) {
      AcceptConnection(in_stack_ffffffffffffffd0,(ListenSocket *)hListenSocket._M_cur);
    }
    __gnu_cxx::
    __normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
    ::operator++((__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                  *)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SocketHandlerListening(const Sock::EventsPerSock& events_per_sock)
{
    for (const ListenSocket& listen_socket : vhListenSocket) {
        if (interruptNet) {
            return;
        }
        const auto it = events_per_sock.find(listen_socket.sock);
        if (it != events_per_sock.end() && it->second.occurred & Sock::RECV) {
            AcceptConnection(listen_socket);
        }
    }
}